

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  char *__s;
  string *psVar1;
  size_t sVar2;
  string *extraout_RAX;
  long *plVar3;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  long lVar4;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  if (environment_variables._M_array != (iterator)0x0) {
    lVar4 = 0;
    do {
      __s = getenv(*(char **)(this + lVar4));
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        sVar2 = strlen(__s);
        if (__s[sVar2 - 1] == '/') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,__s,__s + sVar2);
          return extraout_RAX;
        }
        local_50 = local_40;
        sVar2 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar2);
        plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*plVar3,plVar3[1] + *plVar3);
        if (local_50 == local_40) {
          return extraout_RAX_00;
        }
        operator_delete(local_50,local_40[0] + 1);
        return extraout_RAX_01;
      }
      lVar4 = lVar4 + 8;
    } while ((long)environment_variables._M_array << 3 != lVar4);
  }
  psVar1 = (string *)
           std::__cxx11::string::string
                     ((string *)__return_storage_ptr__,(char *)environment_variables._M_len,
                      (allocator *)&local_50);
  return psVar1;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}